

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O0

void ACIWnd::MoveAllVR(bool bIntoVR)

{
  bool bVar1;
  WndMode WVar2;
  iterator iVar3;
  reference ppAVar4;
  byte in_DIL;
  ACIWnd *pWnd_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *__range2_1;
  ACIWnd *pWnd;
  iterator __end2;
  iterator __begin2;
  list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *__range2;
  LTImgWindow *in_stack_ffffffffffffffb8;
  _Self local_40;
  _Self in_stack_ffffffffffffffc8;
  LTImgWindow *in_stack_ffffffffffffffd0;
  list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *this;
  _Self local_20;
  _Self local_18;
  list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *local_10;
  byte local_1;
  
  local_1 = in_DIL & 1;
  if (local_1 == 0) {
    this = &listACIWnd_abi_cxx11_;
    iVar3 = std::__cxx11::list<ACIWnd_*,_std::allocator<ACIWnd_*>_>::begin
                      ((list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)in_stack_ffffffffffffffb8);
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<ACIWnd_*,_std::allocator<ACIWnd_*>_>::end
                   ((list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)in_stack_ffffffffffffffb8);
    while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffc8,&local_40), bVar1) {
      ppAVar4 = std::_List_iterator<ACIWnd_*>::operator*((_List_iterator<ACIWnd_*> *)0x12236b);
      WVar2 = LTImgWindow::GetMode(&(*ppAVar4)->super_LTImgWindow);
      if (WVar2 == WND_MODE_VR) {
        LTImgWindow::SetMode((LTImgWindow *)this,(WndMode)((ulong)iVar3._M_node >> 0x20));
      }
      std::_List_iterator<ACIWnd_*>::operator++
                ((_List_iterator<ACIWnd_*> *)&stack0xffffffffffffffc8);
    }
  }
  else {
    local_10 = &listACIWnd_abi_cxx11_;
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<ACIWnd_*,_std::allocator<ACIWnd_*>_>::begin
                   ((list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)in_stack_ffffffffffffffb8);
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<ACIWnd_*,_std::allocator<ACIWnd_*>_>::end
                   ((list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)in_stack_ffffffffffffffb8);
    while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
      std::_List_iterator<ACIWnd_*>::operator*((_List_iterator<ACIWnd_*> *)0x1222e5);
      WVar2 = LTImgWindow::GetMode(in_stack_ffffffffffffffb8);
      if (WVar2 == WND_MODE_FLOAT) {
        LTImgWindow::SetMode
                  (in_stack_ffffffffffffffd0,
                   (WndMode)((ulong)in_stack_ffffffffffffffc8._M_node >> 0x20));
      }
      std::_List_iterator<ACIWnd_*>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void ACIWnd::MoveAllVR (bool bIntoVR)
{
    // move into VR
    if (bIntoVR) {
        for (ACIWnd* pWnd: listACIWnd) {
            if (pWnd->GetMode() == WND_MODE_FLOAT)
                pWnd->SetMode(WND_MODE_VR);
        }
    }
    // move out of VR
    else {
        for (ACIWnd* pWnd: listACIWnd) {
            if (pWnd->GetMode() == WND_MODE_VR)
                pWnd->SetMode(WND_MODE_FLOAT);
        }
    }
}